

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O0

float * __thiscall Rml::ConvolutionFilter::operator[](ConvolutionFilter *this,int kernel_y_index)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  pointer pfVar4;
  int kernel_y_index_local;
  ConvolutionFilter *this_local;
  
  bVar2 = ::std::operator!=(&this->kernel,(nullptr_t)0x0);
  if ((((!bVar2) || (kernel_y_index < 0)) || ((this->kernel_size).y <= kernel_y_index)) &&
     (bVar2 = Assert("RMLUI_ASSERT(kernel != nullptr && kernel_y_index >= 0 && kernel_y_index < kernel_size.y)"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                     ,0x3f), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar3 = Math::Clamp<int>(kernel_y_index,0,(this->kernel_size).y + -1);
  pfVar4 = ::std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->kernel);
  return pfVar4 + (this->kernel_size).x * iVar3;
}

Assistant:

float* ConvolutionFilter::operator[](int kernel_y_index)
{
	RMLUI_ASSERT(kernel != nullptr && kernel_y_index >= 0 && kernel_y_index < kernel_size.y);

	kernel_y_index = Math::Clamp(kernel_y_index, 0, kernel_size.y - 1);

	return kernel.get() + kernel_size.x * kernel_y_index;
}